

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1933e1::ConvolveTestBase::IsIndexInBorder(ConvolveTestBase *this,int i)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  undefined4 in_stack_ffffffffffffffd0;
  undefined1 local_d;
  
  iVar1 = BorderTop((ConvolveTestBase *)0x4460a4);
  local_d = true;
  if (iVar1 * 0x200 <= in_ESI) {
    iVar1 = BorderTop((ConvolveTestBase *)0x4460cd);
    iVar2 = Height((ConvolveTestBase *)0x4460db);
    local_d = true;
    if (in_ESI < (iVar1 + iVar2) * 0x200) {
      iVar2 = in_ESI % 0x200;
      iVar1 = BorderLeft((ConvolveTestBase *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      local_d = true;
      if (iVar1 <= iVar2) {
        iVar1 = BorderLeft((ConvolveTestBase *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
        iVar2 = Width((ConvolveTestBase *)0x446144);
        local_d = iVar1 + iVar2 <= in_ESI % 0x200;
      }
    }
  }
  return local_d;
}

Assistant:

bool IsIndexInBorder(int i) {
    return (i < BorderTop() * kOuterBlockSize ||
            i >= (BorderTop() + Height()) * kOuterBlockSize ||
            i % kOuterBlockSize < BorderLeft() ||
            i % kOuterBlockSize >= (BorderLeft() + Width()));
  }